

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_>::reserve
          (Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *this,
          size_t size)

{
  Vector<kj::StringPtr>::reserve((Vector<kj::StringPtr> *)this,size);
  _::BTreeImpl::reserve((BTreeImpl *)(this + 0x28),size);
  return;
}

Assistant:

void Table<Row, Indexes...>::reserve(size_t size) {
  rows.reserve(size);
  Impl<>::reserve(*this, size);
}